

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

MempoolAcceptResult * __thiscall
ChainstateManager::ProcessTransaction
          (MempoolAcceptResult *__return_storage_ptr__,ChainstateManager *this,CTransactionRef *tx,
          bool test_accept)

{
  long lVar1;
  CTxMemPool *this_00;
  Chainstate *active_chainstate;
  int64_t accept_time;
  CCoinsViewCache *active_coins_tip;
  long in_FS_OFFSET;
  ValidationState<TxValidationResult> in_stack_fffffffffffffef8;
  string local_b0;
  string local_90;
  TxValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  active_chainstate = ActiveChainstate(this);
  if (active_chainstate->m_mempool == (CTxMemPool *)0x0) {
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"no-mempool",(allocator<char> *)&stack0xffffffffffffff07);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"",(allocator<char> *)&stack0xffffffffffffff06);
    ValidationState<TxValidationResult>::Invalid
              (&state.super_ValidationState<TxValidationResult>,TX_NO_MEMPOOL,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    ValidationState<TxValidationResult>::ValidationState
              ((ValidationState<TxValidationResult> *)&stack0xffffffffffffff08,
               &state.super_ValidationState<TxValidationResult>);
    MempoolAcceptResult::Failure
              (__return_storage_ptr__,(TxValidationState)in_stack_fffffffffffffef8);
    ValidationState<TxValidationResult>::~ValidationState
              ((ValidationState<TxValidationResult> *)&stack0xffffffffffffff08);
    ValidationState<TxValidationResult>::~ValidationState
              (&state.super_ValidationState<TxValidationResult>);
  }
  else {
    accept_time = GetTime();
    AcceptToMemoryPool(__return_storage_ptr__,active_chainstate,tx,accept_time,false,test_accept);
    this_00 = active_chainstate->m_mempool;
    active_coins_tip = Chainstate::CoinsTip(active_chainstate);
    CTxMemPool::check(this_00,active_coins_tip,
                      (long)(int)((ulong)((long)(active_chainstate->m_chain).vChain.
                                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(active_chainstate->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

MempoolAcceptResult ChainstateManager::ProcessTransaction(const CTransactionRef& tx, bool test_accept)
{
    AssertLockHeld(cs_main);
    Chainstate& active_chainstate = ActiveChainstate();
    if (!active_chainstate.GetMempool()) {
        TxValidationState state;
        state.Invalid(TxValidationResult::TX_NO_MEMPOOL, "no-mempool");
        return MempoolAcceptResult::Failure(state);
    }
    auto result = AcceptToMemoryPool(active_chainstate, tx, GetTime(), /*bypass_limits=*/ false, test_accept);
    active_chainstate.GetMempool()->check(active_chainstate.CoinsTip(), active_chainstate.m_chain.Height() + 1);
    return result;
}